

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::
FixContainingTypeInDescriptor<google::protobuf::EnumDescriptor>
          (Generator *this,EnumDescriptor *descriptor,Descriptor *containing_descriptor)

{
  string_view text;
  string nested_name;
  string parent_name;
  
  if (containing_descriptor != (Descriptor *)0x0) {
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&nested_name,this,descriptor);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&parent_name,this,containing_descriptor)
    ;
    text._M_str = "$nested_name$.containing_type = $parent_name$\n";
    text._M_len = 0x2e;
    io::Printer::Print<char[12],std::__cxx11::string,char[12],std::__cxx11::string>
              (this->printer_,text,(char (*) [12])"nested_name",&nested_name,
               (char (*) [12])"parent_name",&parent_name);
    std::__cxx11::string::~string((string *)&parent_name);
    std::__cxx11::string::~string((string *)&nested_name);
  }
  return;
}

Assistant:

void Generator::FixContainingTypeInDescriptor(
    const DescriptorT& descriptor,
    const Descriptor* containing_descriptor) const {
  if (containing_descriptor != nullptr) {
    const std::string nested_name = ModuleLevelDescriptorName(descriptor);
    const std::string parent_name =
        ModuleLevelDescriptorName(*containing_descriptor);
    printer_->Print("$nested_name$.containing_type = $parent_name$\n",
                    "nested_name", nested_name, "parent_name", parent_name);
  }
}